

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

Publication * __thiscall
helics::ValueFederateManager::registerPublication
          (ValueFederateManager *this,string_view key,string_view type,string_view units)

{
  string_view message;
  string_view searchValue1;
  string_view typeName;
  bool bVar1;
  DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *pDVar2;
  Publication *pPVar3;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  size_t in_RSI;
  InterfaceHandle *in_RDI;
  optional<unsigned_long> oVar4;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  optional<unsigned_long> active;
  handle pubHandle;
  InterfaceHandle coreID;
  char *in_stack_fffffffffffffeb8;
  char *pcVar5;
  undefined8 in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *in_stack_fffffffffffffee8;
  ValueFederate **in_stack_ffffffffffffff00;
  InterfaceHandle *in_stack_ffffffffffffff08;
  DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff21;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  size_t in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  local_98;
  size_t local_70;
  char *local_68;
  size_t local_60;
  basic_string_view<char,_std::char_traits<char>_> *local_58;
  BaseType local_50;
  undefined4 local_4c [5];
  string_view local_38;
  size_t local_20;
  char *local_18;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  pcVar5 = (char *)&stack0x00000008;
  local_10._M_len = in_RSI;
  local_10._M_str = (char *)in_RDX;
  if ((in_RDI->hid & 1) == 0) {
    typeName._M_str = in_stack_ffffffffffffff60;
    typeName._M_len = in_stack_ffffffffffffff58;
    local_38 = getCleanedTypeName(typeName);
  }
  else {
    local_38._M_str = "json";
    local_38._M_len = 4;
  }
  local_20 = local_38._M_len;
  local_18 = local_38._M_str;
  local_50 = in_RDI[1].hid;
  local_60 = local_10._M_len;
  local_58 = (basic_string_view<char,_std::char_traits<char>_> *)local_10._M_str;
  local_70 = local_38._M_len;
  local_68 = local_38._M_str;
  local_4c[0] = (**(code **)(**(long **)(in_RDI + 0x80) + 0x120))
                          (*(long **)(in_RDI + 0x80),local_50,local_10._M_len,local_10._M_str,
                           local_38._M_len,local_38._M_str,in_stack_00000008,in_stack_00000010);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(in_stack_fffffffffffffee8);
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x2dc50a);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (bVar1) {
    pDVar2 = gmlc::libguarded::
             lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
             ::operator->(&local_98);
    oVar4 = gmlc::containers::
            DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
            ::
            insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      (pDVar2,local_4c,in_RDI + 0x82,local_4c,&local_10,&local_20,pcVar5);
    in_stack_fffffffffffffed7 =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
  }
  else {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::operator->(&local_98);
    searchValue1._M_str._0_1_ = in_stack_ffffffffffffff20;
    searchValue1._M_len = in_stack_ffffffffffffff18;
    searchValue1._M_str._1_7_ = in_stack_ffffffffffffff21;
    gmlc::containers::
    DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>::
    insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
              (in_stack_ffffffffffffff10,searchValue1,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff00,in_RDI,
               (basic_string_view<char,_std::char_traits<char>_> *)local_10._M_str,
               in_stack_ffffffffffffff48,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50));
    in_stack_fffffffffffffeb8 = pcVar5;
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x2dc687);
  if (!bVar1) {
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,in_stack_fffffffffffffeb8);
    message._M_str._0_7_ = in_stack_fffffffffffffed0;
    message._M_len = in_stack_fffffffffffffec8;
    message._M_str._7_1_ = in_stack_fffffffffffffed7;
    RegistrationFailure::RegistrationFailure((RegistrationFailure *)this_00,message);
    __cxa_throw(this_00,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::operator->(&local_98);
  pPVar3 = gmlc::containers::
           DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
           ::back((DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
                   *)0x2dc6a2);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                  *)0x2dc6b6);
  return pPVar3;
}

Assistant:

Publication& ValueFederateManager::registerPublication(std::string_view key,
                                                       std::string_view type,
                                                       std::string_view units)
{
    type = useJsonSerialization ? jsonStringType : getCleanedTypeName(type);
    auto coreID = coreObject->registerPublication(fedID, key, type, units);

    auto pubHandle = publications.lock();
    decltype(pubHandle->insert(key, coreID, fed, coreID, key, type, units)) active;
    if (!key.empty()) {
        active = pubHandle->insert(key, coreID, fed, coreID, key, type, units);
    } else {
        active = pubHandle->insert(no_search, coreID, fed, coreID, key, type, units);
    }

    if (active) {
        return pubHandle->back();
    }
    throw(RegistrationFailure("Unable to register Publication"));
}